

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O3

void __thiscall Triangle_BadCases_Test::~Triangle_BadCases_Test(Triangle_BadCases_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Triangle, BadCases) {
    Transform identity;
    std::vector<int> indices{0, 1, 2};
    std::vector<Point3f> p{Point3f(-1113.45459, -79.049614, -56.2431908),
                           Point3f(-1113.45459, -87.0922699, -56.2431908),
                           Point3f(-1113.45459, -79.2090149, -56.2431908)};
    TriangleMesh mesh(identity, false, indices, p, {}, {}, {}, {});
    auto tris = Triangle::CreateTriangles(&mesh, Allocator());
    ASSERT_EQ(1, tris.size());

    Ray ray(Point3f(-1081.47925, 99.9999542, 87.7701111),
            Vector3f(-32.1072998, -183.355865, -144.607635), 0.9999);

    EXPECT_FALSE(tris[0].Intersect(ray).has_value());
}